

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QGenericArrayOps<LibrarySearchPath>::copyAppend
          (QGenericArrayOps<LibrarySearchPath> *this,LibrarySearchPath *b,LibrarySearchPath *e)

{
  LibrarySearchPath *pLVar1;
  Data *pDVar2;
  long lVar3;
  
  if ((b != e) && (b < e)) {
    pLVar1 = (this->super_QArrayDataPointer<LibrarySearchPath>).ptr;
    lVar3 = (this->super_QArrayDataPointer<LibrarySearchPath>).size;
    do {
      pDVar2 = (b->super_QMakeLocalFileName).real_name.d.d;
      pLVar1[lVar3].super_QMakeLocalFileName.real_name.d.d = pDVar2;
      pLVar1[lVar3].super_QMakeLocalFileName.real_name.d.ptr =
           (b->super_QMakeLocalFileName).real_name.d.ptr;
      pLVar1[lVar3].super_QMakeLocalFileName.real_name.d.size =
           (b->super_QMakeLocalFileName).real_name.d.size;
      if (pDVar2 != (Data *)0x0) {
        LOCK();
        (pDVar2->super_QArrayData).ref_._q_value =
             (Type)((int)(pDVar2->super_QArrayData).ref_._q_value + 1);
        UNLOCK();
      }
      pDVar2 = (b->super_QMakeLocalFileName).local_name.d.d;
      pLVar1[lVar3].super_QMakeLocalFileName.local_name.d.d = pDVar2;
      pLVar1[lVar3].super_QMakeLocalFileName.local_name.d.ptr =
           (b->super_QMakeLocalFileName).local_name.d.ptr;
      pLVar1[lVar3].super_QMakeLocalFileName.local_name.d.size =
           (b->super_QMakeLocalFileName).local_name.d.size;
      if (pDVar2 != (Data *)0x0) {
        LOCK();
        (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      pLVar1[lVar3]._default = b->_default;
      b = b + 1;
      lVar3 = (this->super_QArrayDataPointer<LibrarySearchPath>).size + 1;
      (this->super_QArrayDataPointer<LibrarySearchPath>).size = lVar3;
    } while (b < e);
  }
  return;
}

Assistant:

void copyAppend(const T *b, const T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e) // short-cut and handling the case b and e == nullptr
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(*b);
            ++b;
            ++this->size;
        }
    }